

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  ImDrawListSharedData *pIVar1;
  ImDrawList *this_00;
  
  this_00 = (ImDrawList *)ImGui::MemAlloc(200);
  pIVar1 = this->_Data;
  (this_00->_Splitter)._Current = 0;
  (this_00->_Splitter)._Count = 0;
  (this_00->_Splitter)._Channels.Size = 0;
  (this_00->_Splitter)._Channels.Capacity = 0;
  (this_00->_Splitter)._Channels.Data = (ImDrawChannel *)0x0;
  memset(this_00,0,200);
  this_00->_Data = pIVar1;
  ImVector<ImDrawCmd>::operator=((ImVector<ImDrawCmd> *)this_00,&this->CmdBuffer);
  ImVector<unsigned_short>::operator=(&this_00->IdxBuffer,&this->IdxBuffer);
  ImVector<ImDrawVert>::operator=(&this_00->VtxBuffer,&this->VtxBuffer);
  this_00->Flags = this->Flags;
  return this_00;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}